

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void HRSS_poly3_invert(poly3 *out,poly3 *in)

{
  int iVar1;
  crypto_word_t cVar2;
  crypto_word_t local_320;
  crypto_word_t c_a;
  crypto_word_t c_s;
  crypto_word_t mask;
  crypto_word_t g_has_constant_term;
  crypto_word_t delta_is_non_zero;
  crypto_word_t delta_is_non_negative;
  crypto_word_t delta_sign_bit;
  size_t i;
  undefined1 auStack_2d8 [4];
  int delta;
  poly3 g;
  poly3 f;
  poly3 r;
  poly3 v;
  poly3 *in_local;
  poly3 *out_local;
  
  iVar1 = vec_capable();
  if (iVar1 == 0) {
    poly3_zero((poly3 *)(r.a.v + 10));
    poly3_zero((poly3 *)(f.a.v + 10));
    r.s.v[10] = 1;
    OPENSSL_memset(g.a.v + 10,0,0x58);
    OPENSSL_memset(f.s.v + 10,0xff,0x58);
    f.a.v[9] = f.a.v[9] >> 3;
    poly3_reverse_700((poly3 *)auStack_2d8,in);
    i._4_4_ = 1;
    for (delta_sign_bit = 0; delta_sign_bit < 0x577; delta_sign_bit = delta_sign_bit + 1) {
      poly3_lshift1((poly3 *)(r.a.v + 10));
      delta_is_non_negative = (crypto_word_t)(int)(i._4_4_ >> 0x1f & 1);
      delta_is_non_zero = delta_is_non_negative - 1;
      cVar2 = constant_time_is_zero_w((long)i._4_4_);
      g_has_constant_term = cVar2 ^ 0xffffffffffffffff;
      mask = lsb_to_all(g.s.v[10]);
      c_s = mask & delta_is_non_zero & g_has_constant_term;
      poly3_word_mul(&c_a,&local_320,g.a.v[10],f.s.v[10],_auStack_2d8,g.s.v[10]);
      c_a = lsb_to_all(c_a);
      local_320 = lsb_to_all(local_320);
      iVar1 = constant_time_select_int(c_s,-i._4_4_,i._4_4_);
      i._4_4_ = iVar1 + 1;
      poly3_cswap((poly3 *)(g.a.v + 10),(poly3 *)auStack_2d8,c_s);
      poly3_fmsub((poly3 *)auStack_2d8,(poly3 *)(g.a.v + 10),c_a,local_320);
      poly3_rshift1((poly3 *)auStack_2d8);
      poly3_cswap((poly3 *)(r.a.v + 10),(poly3 *)(f.a.v + 10),c_s);
      poly3_fmsub((poly3 *)(f.a.v + 10),(poly3 *)(r.a.v + 10),c_a,local_320);
    }
    if (i._4_4_ != 0) {
      __assert_fail("delta == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                    ,0x342,"void HRSS_poly3_invert(struct poly3 *, const struct poly3 *)");
    }
    poly3_mul_const((poly3 *)(r.a.v + 10),g.a.v[10],f.s.v[10]);
    poly3_reverse_700(out,(poly3 *)(r.a.v + 10));
  }
  else {
    poly3_invert_vec(out,in);
  }
  return;
}

Assistant:

void HRSS_poly3_invert(struct poly3 *out, const struct poly3 *in) {
  // The vector version of this function seems slightly slower on AArch64, but
  // is useful on ARMv7 and x86-64.
#if defined(HRSS_HAVE_VECTOR_UNIT) && !defined(OPENSSL_AARCH64)
  if (vec_capable()) {
    poly3_invert_vec(out, in);
    return;
  }
#endif

  // This algorithm is taken from section 7.1 of [SAFEGCD].
  struct poly3 v, r, f, g;
  // v = 0
  poly3_zero(&v);
  // r = 1
  poly3_zero(&r);
  r.a.v[0] = 1;
  // f = all ones.
  OPENSSL_memset(&f.s, 0, sizeof(struct poly2));
  OPENSSL_memset(&f.a, 0xff, sizeof(struct poly2));
  f.a.v[WORDS_PER_POLY - 1] >>= BITS_PER_WORD - BITS_IN_LAST_WORD;
  // g is the reversal of |in|.
  poly3_reverse_700(&g, in);
  int delta = 1;

  for (size_t i = 0; i < (2 * (N - 1)) - 1; i++) {
    poly3_lshift1(&v);

    const crypto_word_t delta_sign_bit = (delta >> (sizeof(delta) * 8 - 1)) & 1;
    const crypto_word_t delta_is_non_negative = delta_sign_bit - 1;
    const crypto_word_t delta_is_non_zero = ~constant_time_is_zero_w(delta);
    const crypto_word_t g_has_constant_term = lsb_to_all(g.a.v[0]);
    const crypto_word_t mask =
        g_has_constant_term & delta_is_non_negative & delta_is_non_zero;

    crypto_word_t c_s, c_a;
    poly3_word_mul(&c_s, &c_a, f.s.v[0], f.a.v[0], g.s.v[0], g.a.v[0]);
    c_s = lsb_to_all(c_s);
    c_a = lsb_to_all(c_a);

    delta = constant_time_select_int(mask, -delta, delta);
    delta++;

    poly3_cswap(&f, &g, mask);
    poly3_fmsub(&g, &f, c_s, c_a);
    poly3_rshift1(&g);

    poly3_cswap(&v, &r, mask);
    poly3_fmsub(&r, &v, c_s, c_a);
  }

  assert(delta == 0);
  poly3_mul_const(&v, f.s.v[0], f.a.v[0]);
  poly3_reverse_700(out, &v);
}